

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void idtx4x4_sse4_1(__m128i *in,__m128i *out,int bit,int col_num)

{
  __m128i *palVar1;
  undefined1 auVar2 [16];
  int local_10c;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int i;
  __m128i a_low;
  __m128i offset;
  __m128i fact;
  int col_num_local;
  int bit_local;
  __m128i *out_local;
  __m128i *in_local;
  
  for (local_10c = 0; local_10c < 4; local_10c = local_10c + 1) {
    auVar2._8_8_ = 0x16a1000016a1;
    auVar2._0_8_ = 0x16a1000016a1;
    auVar2 = pmulld((undefined1  [16])in[local_10c * col_num],auVar2);
    local_a8 = auVar2._0_4_;
    iStack_a4 = auVar2._4_4_;
    iStack_a0 = auVar2._8_4_;
    iStack_9c = auVar2._12_4_;
    auVar2 = ZEXT416(0xc);
    palVar1 = out + local_10c;
    *(int *)*palVar1 = local_a8 + 0x800 >> auVar2;
    *(int *)((long)*palVar1 + 4) = iStack_a4 + 0x800 >> auVar2;
    *(int *)(*palVar1 + 1) = iStack_a0 + 0x800 >> auVar2;
    *(int *)((long)*palVar1 + 0xc) = iStack_9c + 0x800 >> auVar2;
  }
  return;
}

Assistant:

static void idtx4x4_sse4_1(__m128i *in, __m128i *out, int bit, int col_num) {
  (void)bit;
  __m128i fact = _mm_set1_epi32(NewSqrt2);
  __m128i offset = _mm_set1_epi32(1 << (NewSqrt2Bits - 1));
  __m128i a_low;

  for (int i = 0; i < 4; i++) {
    a_low = _mm_mullo_epi32(in[i * col_num], fact);
    a_low = _mm_add_epi32(a_low, offset);
    out[i] = _mm_srai_epi32(a_low, NewSqrt2Bits);
  }
}